

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int unqlite_compile_file(unqlite *pDb,char *zPath,unqlite_vm **ppOut)

{
  jx9 *pEngine;
  jx9_vfs *pjVar1;
  int iVar2;
  sxi32 sVar3;
  char *in_R8;
  jx9_vm *pVm;
  jx9_int64 nSize;
  void *pMapView;
  jx9_vm *local_58;
  jx9_int64 local_50;
  char *local_48;
  SyString local_40;
  
  sVar3 = -0x18;
  if (((pDb != (unqlite *)0x0) && (ppOut != (unqlite_vm **)0x0)) && (pDb->nMagic == 0xdb7c2712)) {
    pEngine = (pDb->sDB).pJx9;
    local_58 = (jx9_vm *)0x0;
    if (((pEngine != (jx9 *)0x0) && (zPath != (char *)0x0)) &&
       ((pEngine->nMagic == 0xf874bcd7 && (*zPath != '\0')))) {
      pjVar1 = pEngine->pVfs;
      sVar3 = -2;
      if ((pjVar1 != (jx9_vfs *)0x0) &&
         (pjVar1->xMmap != (_func_int_char_ptr_void_ptr_ptr_jx9_int64_ptr *)0x0)) {
        local_48 = (char *)0x0;
        local_50 = 0;
        iVar2 = (*pjVar1->xMmap)(zPath,&local_48,&local_50);
        sVar3 = -2;
        if (iVar2 == 0) {
          local_40.zString = local_48;
          local_40.nByte = (uint)local_50;
          sVar3 = ProcessScript(pEngine,&local_58,&local_40,(sxi32)zPath,in_R8);
          if (pjVar1->xUnmap != (_func_void_void_ptr_jx9_int64 *)0x0) {
            (*pjVar1->xUnmap)(local_48,local_50);
          }
        }
      }
    }
    if (sVar3 == 0) {
      iVar2 = unqliteInitVm(pDb,local_58,ppOut);
      if (iVar2 == 0) {
        sVar3 = 0;
      }
      else {
        jx9_vm_release(local_58);
        sVar3 = -1;
      }
    }
  }
  return sVar3;
}

Assistant:

int unqlite_compile_file(unqlite *pDb,const char *zPath,unqlite_vm **ppOut)
{
	jx9_vm *pVm;
	int rc;
	if( UNQLITE_DB_MISUSE(pDb) || ppOut == 0){
		return UNQLITE_CORRUPT;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire DB mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_DB_RELEASE(pDb) ){
			 return UNQLITE_ABORT;
	 }
#endif
	 /* Compile the Jx9 script first */
	rc = jx9_compile_file(pDb->sDB.pJx9,zPath,&pVm);
	if( rc == JX9_OK ){
		/* Allocate a new unqlite VM instance */
		rc = unqliteInitVm(pDb,pVm,ppOut);
		if( rc != UNQLITE_OK ){
			/* Release the Jx9 VM */
			jx9_vm_release(pVm);
		}
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pDb->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}